

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16781328,_true,_embree::avx2::VirtualCurveIntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  float fVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  char cVar22;
  AABBNodeMB4D *node1;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  ulong *puVar29;
  ulong uVar30;
  ulong uVar31;
  bool bVar32;
  vint4 ai_1;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 bi_1;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vint4 ai_3;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  vint4 bi_3;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  vint4 ai;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  vint4 bi;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  NodeRef stack [244];
  size_t local_7d8;
  ulong local_7d0 [244];
  
  puVar29 = local_7d0;
  local_7d8 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar57._4_4_ = uVar1;
  auVar57._0_4_ = uVar1;
  auVar57._8_4_ = uVar1;
  auVar57._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar58._4_4_ = uVar1;
  auVar58._0_4_ = uVar1;
  auVar58._8_4_ = uVar1;
  auVar58._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar2 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar3 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar12 = fVar5 * 0.99999964;
  fVar13 = fVar6 * 0.99999964;
  fVar14 = fVar7 * 0.99999964;
  fVar5 = fVar5 * 1.0000004;
  fVar6 = fVar6 * 1.0000004;
  fVar7 = fVar7 * 1.0000004;
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar8 = (tray->tnear).field_0.i[k];
  auVar60._4_4_ = iVar8;
  auVar60._0_4_ = iVar8;
  auVar60._8_4_ = iVar8;
  auVar60._12_4_ = iVar8;
  iVar8 = (tray->tfar).field_0.i[k];
  auVar61._4_4_ = iVar8;
  auVar61._0_4_ = iVar8;
  auVar61._8_4_ = iVar8;
  auVar61._12_4_ = iVar8;
LAB_0052490a:
  do {
    bVar10 = puVar29 != &local_7d8;
    if (puVar29 == &local_7d8) {
      return bVar10;
    }
    uVar26 = puVar29[-1];
    puVar29 = puVar29 + -1;
    while ((uVar26 & 8) == 0) {
      fVar9 = *(float *)(ray + k * 4 + 0x70);
      uVar24 = (uint)uVar26 & 7;
      uVar23 = uVar26 & 0xfffffffffffffff0;
      if (uVar24 == 3) {
        auVar34 = *(undefined1 (*) [16])(uVar23 + 0x80);
        auVar11 = *(undefined1 (*) [16])(uVar23 + 0x90);
        fVar15 = 1.0 - fVar9;
        auVar45._4_4_ = fVar15;
        auVar45._0_4_ = fVar15;
        auVar45._8_4_ = fVar15;
        auVar45._12_4_ = fVar15;
        auVar59._0_4_ = fVar9 * *(float *)(uVar23 + 0xe0);
        auVar59._4_4_ = fVar9 * *(float *)(uVar23 + 0xe4);
        auVar59._8_4_ = fVar9 * *(float *)(uVar23 + 0xe8);
        auVar59._12_4_ = fVar9 * *(float *)(uVar23 + 0xec);
        auVar55._0_4_ = fVar9 * *(float *)(uVar23 + 0xf0);
        auVar55._4_4_ = fVar9 * *(float *)(uVar23 + 0xf4);
        auVar55._8_4_ = fVar9 * *(float *)(uVar23 + 0xf8);
        auVar55._12_4_ = fVar9 * *(float *)(uVar23 + 0xfc);
        auVar39._0_4_ = fVar9 * *(float *)(uVar23 + 0x100);
        auVar39._4_4_ = fVar9 * *(float *)(uVar23 + 0x104);
        auVar39._8_4_ = fVar9 * *(float *)(uVar23 + 0x108);
        auVar39._12_4_ = fVar9 * *(float *)(uVar23 + 0x10c);
        auVar35._0_12_ = ZEXT812(0);
        auVar35._12_4_ = 0;
        auVar17 = vfmadd231ps_fma(auVar59,auVar45,auVar35);
        auVar18 = vfmadd231ps_fma(auVar55,auVar45,auVar35);
        auVar37 = vfmadd231ps_fma(auVar39,auVar45,auVar35);
        auVar46._0_4_ = fVar4 * auVar34._0_4_;
        auVar46._4_4_ = fVar4 * auVar34._4_4_;
        auVar46._8_4_ = fVar4 * auVar34._8_4_;
        auVar46._12_4_ = fVar4 * auVar34._12_4_;
        auVar50._0_4_ = fVar4 * auVar11._0_4_;
        auVar50._4_4_ = fVar4 * auVar11._4_4_;
        auVar50._8_4_ = fVar4 * auVar11._8_4_;
        auVar50._12_4_ = fVar4 * auVar11._12_4_;
        auVar20._4_4_ = uVar3;
        auVar20._0_4_ = uVar3;
        auVar20._8_4_ = uVar3;
        auVar20._12_4_ = uVar3;
        auVar35 = vfmadd231ps_fma(auVar46,auVar20,*(undefined1 (*) [16])(uVar23 + 0x50));
        auVar36 = vfmadd231ps_fma(auVar50,auVar20,*(undefined1 (*) [16])(uVar23 + 0x60));
        auVar16._4_4_ = uVar2;
        auVar16._0_4_ = uVar2;
        auVar16._8_4_ = uVar2;
        auVar16._12_4_ = uVar2;
        auVar19 = vfmadd231ps_fma(auVar35,auVar16,*(undefined1 (*) [16])(uVar23 + 0x20));
        auVar36 = vfmadd231ps_fma(auVar36,auVar16,*(undefined1 (*) [16])(uVar23 + 0x30));
        auVar62._8_4_ = 0x7fffffff;
        auVar62._0_8_ = 0x7fffffff7fffffff;
        auVar62._12_4_ = 0x7fffffff;
        auVar35 = vandps_avx(auVar62,auVar19);
        auVar53._8_4_ = 0x219392ef;
        auVar53._0_8_ = 0x219392ef219392ef;
        auVar53._12_4_ = 0x219392ef;
        auVar35 = vcmpps_avx(auVar35,auVar53,1);
        auVar19 = vblendvps_avx(auVar19,auVar53,auVar35);
        auVar35 = vandps_avx(auVar62,auVar36);
        auVar35 = vcmpps_avx(auVar35,auVar53,1);
        auVar39 = vblendvps_avx(auVar36,auVar53,auVar35);
        auVar35 = *(undefined1 (*) [16])(uVar23 + 0xa0);
        auVar36._0_4_ = auVar35._0_4_ * fVar4;
        auVar36._4_4_ = auVar35._4_4_ * fVar4;
        auVar36._8_4_ = auVar35._8_4_ * fVar4;
        auVar36._12_4_ = auVar35._12_4_ * fVar4;
        auVar36 = vfmadd231ps_fma(auVar36,auVar20,*(undefined1 (*) [16])(uVar23 + 0x70));
        auVar20 = vfmadd231ps_fma(auVar36,auVar16,*(undefined1 (*) [16])(uVar23 + 0x40));
        auVar36 = vandps_avx(auVar62,auVar20);
        auVar36 = vcmpps_avx(auVar36,auVar53,1);
        auVar36 = vblendvps_avx(auVar20,auVar53,auVar36);
        auVar20 = vrcpps_avx(auVar19);
        auVar40._8_4_ = 0x3f800000;
        auVar40._0_8_ = 0x3f8000003f800000;
        auVar40._12_4_ = 0x3f800000;
        auVar19 = vfnmadd213ps_fma(auVar19,auVar20,auVar40);
        auVar20 = vfmadd132ps_fma(auVar19,auVar20,auVar20);
        auVar19 = vrcpps_avx(auVar39);
        auVar39 = vfnmadd213ps_fma(auVar39,auVar19,auVar40);
        auVar16 = vfmadd132ps_fma(auVar39,auVar19,auVar19);
        auVar19 = vrcpps_avx(auVar36);
        auVar36 = vfnmadd213ps_fma(auVar36,auVar19,auVar40);
        auVar40 = vfmadd132ps_fma(auVar36,auVar19,auVar19);
        auVar19._4_4_ = uVar1;
        auVar19._0_4_ = uVar1;
        auVar19._8_4_ = uVar1;
        auVar19._12_4_ = uVar1;
        auVar34 = vfmadd213ps_fma(auVar34,auVar19,*(undefined1 (*) [16])(uVar23 + 0xb0));
        auVar36 = vfmadd231ps_fma(auVar34,*(undefined1 (*) [16])(uVar23 + 0x50),auVar58);
        auVar34 = vfmadd213ps_fma(auVar11,auVar19,*(undefined1 (*) [16])(uVar23 + 0xc0));
        auVar11 = vfmadd213ps_fma(auVar35,auVar19,*(undefined1 (*) [16])(uVar23 + 0xd0));
        auVar34 = vfmadd231ps_fma(auVar34,*(undefined1 (*) [16])(uVar23 + 0x60),auVar58);
        auVar11 = vfmadd231ps_fma(auVar11,auVar58,*(undefined1 (*) [16])(uVar23 + 0x70));
        auVar35 = vfmadd231ps_fma(auVar36,auVar57,*(undefined1 (*) [16])(uVar23 + 0x20));
        auVar36 = vfmadd231ps_fma(auVar34,auVar57,*(undefined1 (*) [16])(uVar23 + 0x30));
        auVar39 = vfmadd231ps_fma(auVar11,auVar57,*(undefined1 (*) [16])(uVar23 + 0x40));
        auVar34 = vsubps_avx(auVar17,auVar35);
        auVar11._4_4_ = fVar9 * *(float *)(uVar23 + 0x114) + fVar15;
        auVar11._0_4_ = fVar9 * *(float *)(uVar23 + 0x110) + fVar15;
        auVar11._8_4_ = fVar9 * *(float *)(uVar23 + 0x118) + fVar15;
        auVar11._12_4_ = fVar9 * *(float *)(uVar23 + 0x11c) + fVar15;
        auVar11 = vsubps_avx(auVar11,auVar35);
        auVar35 = vsubps_avx(auVar18,auVar36);
        auVar17._4_4_ = fVar9 * *(float *)(uVar23 + 0x124) + fVar15;
        auVar17._0_4_ = fVar9 * *(float *)(uVar23 + 0x120) + fVar15;
        auVar17._8_4_ = fVar9 * *(float *)(uVar23 + 0x128) + fVar15;
        auVar17._12_4_ = fVar9 * *(float *)(uVar23 + 300) + fVar15;
        auVar36 = vsubps_avx(auVar17,auVar36);
        auVar19 = vsubps_avx(auVar37,auVar39);
        auVar18._4_4_ = fVar15 + fVar9 * *(float *)(uVar23 + 0x134);
        auVar18._0_4_ = fVar15 + fVar9 * *(float *)(uVar23 + 0x130);
        auVar18._8_4_ = fVar15 + fVar9 * *(float *)(uVar23 + 0x138);
        auVar18._12_4_ = fVar15 + fVar9 * *(float *)(uVar23 + 0x13c);
        auVar39 = vsubps_avx(auVar18,auVar39);
        auVar37._0_4_ = auVar20._0_4_ * auVar34._0_4_;
        auVar37._4_4_ = auVar20._4_4_ * auVar34._4_4_;
        auVar37._8_4_ = auVar20._8_4_ * auVar34._8_4_;
        auVar37._12_4_ = auVar20._12_4_ * auVar34._12_4_;
        auVar41._0_4_ = auVar20._0_4_ * auVar11._0_4_;
        auVar41._4_4_ = auVar20._4_4_ * auVar11._4_4_;
        auVar41._8_4_ = auVar20._8_4_ * auVar11._8_4_;
        auVar41._12_4_ = auVar20._12_4_ * auVar11._12_4_;
        auVar47._0_4_ = auVar16._0_4_ * auVar35._0_4_;
        auVar47._4_4_ = auVar16._4_4_ * auVar35._4_4_;
        auVar47._8_4_ = auVar16._8_4_ * auVar35._8_4_;
        auVar47._12_4_ = auVar16._12_4_ * auVar35._12_4_;
        auVar54._0_4_ = auVar40._0_4_ * auVar19._0_4_;
        auVar54._4_4_ = auVar40._4_4_ * auVar19._4_4_;
        auVar54._8_4_ = auVar40._8_4_ * auVar19._8_4_;
        auVar54._12_4_ = auVar40._12_4_ * auVar19._12_4_;
        auVar51._0_4_ = auVar16._0_4_ * auVar36._0_4_;
        auVar51._4_4_ = auVar16._4_4_ * auVar36._4_4_;
        auVar51._8_4_ = auVar16._8_4_ * auVar36._8_4_;
        auVar51._12_4_ = auVar16._12_4_ * auVar36._12_4_;
        auVar56._0_4_ = auVar40._0_4_ * auVar39._0_4_;
        auVar56._4_4_ = auVar40._4_4_ * auVar39._4_4_;
        auVar56._8_4_ = auVar40._8_4_ * auVar39._8_4_;
        auVar56._12_4_ = auVar40._12_4_ * auVar39._12_4_;
        auVar34 = vpminsd_avx(auVar47,auVar51);
        auVar11 = vpminsd_avx(auVar54,auVar56);
        auVar34 = vmaxps_avx(auVar34,auVar11);
        auVar19 = vpminsd_avx(auVar37,auVar41);
        auVar36 = vpmaxsd_avx(auVar37,auVar41);
        auVar11 = vpmaxsd_avx(auVar47,auVar51);
        auVar35 = vpmaxsd_avx(auVar54,auVar56);
        auVar35 = vminps_avx(auVar11,auVar35);
        auVar11 = vmaxps_avx(auVar60,auVar19);
        auVar34 = vmaxps_avx(auVar11,auVar34);
        auVar11 = vminps_avx(auVar61,auVar36);
        auVar11 = vminps_avx(auVar11,auVar35);
        auVar42._0_4_ = auVar34._0_4_ * 0.99999964;
        auVar42._4_4_ = auVar34._4_4_ * 0.99999964;
        auVar42._8_4_ = auVar34._8_4_ * 0.99999964;
        auVar42._12_4_ = auVar34._12_4_ * 0.99999964;
        auVar34._0_4_ = auVar11._0_4_ * 1.0000004;
        auVar34._4_4_ = auVar11._4_4_ * 1.0000004;
        auVar34._8_4_ = auVar11._8_4_ * 1.0000004;
        auVar34._12_4_ = auVar11._12_4_ * 1.0000004;
        auVar34 = vcmpps_avx(auVar42,auVar34,2);
      }
      else {
        auVar33._4_4_ = fVar9;
        auVar33._0_4_ = fVar9;
        auVar33._8_4_ = fVar9;
        auVar33._12_4_ = fVar9;
        auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + uVar30),auVar33,
                                  *(undefined1 (*) [16])(uVar23 + 0x20 + uVar30));
        auVar34 = vsubps_avx(auVar34,auVar57);
        auVar38._0_4_ = fVar12 * auVar34._0_4_;
        auVar38._4_4_ = fVar12 * auVar34._4_4_;
        auVar38._8_4_ = fVar12 * auVar34._8_4_;
        auVar38._12_4_ = fVar12 * auVar34._12_4_;
        auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + uVar28),auVar33,
                                  *(undefined1 (*) [16])(uVar23 + 0x20 + uVar28));
        auVar34 = vsubps_avx(auVar34,auVar58);
        auVar43._0_4_ = fVar13 * auVar34._0_4_;
        auVar43._4_4_ = fVar13 * auVar34._4_4_;
        auVar43._8_4_ = fVar13 * auVar34._8_4_;
        auVar43._12_4_ = fVar13 * auVar34._12_4_;
        auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + uVar31),auVar33,
                                  *(undefined1 (*) [16])(uVar23 + 0x20 + uVar31));
        auVar21._4_4_ = uVar1;
        auVar21._0_4_ = uVar1;
        auVar21._8_4_ = uVar1;
        auVar21._12_4_ = uVar1;
        auVar34 = vsubps_avx(auVar34,auVar21);
        auVar48._0_4_ = fVar14 * auVar34._0_4_;
        auVar48._4_4_ = fVar14 * auVar34._4_4_;
        auVar48._8_4_ = fVar14 * auVar34._8_4_;
        auVar48._12_4_ = fVar14 * auVar34._12_4_;
        auVar34 = vmaxps_avx(auVar43,auVar48);
        auVar11 = vmaxps_avx(auVar60,auVar38);
        auVar34 = vmaxps_avx(auVar11,auVar34);
        auVar11 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + (uVar30 ^ 0x10)),auVar33,
                                  *(undefined1 (*) [16])(uVar23 + 0x20 + (uVar30 ^ 0x10)));
        auVar11 = vsubps_avx(auVar11,auVar57);
        auVar35 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + (uVar28 ^ 0x10)),auVar33,
                                  *(undefined1 (*) [16])(uVar23 + 0x20 + (uVar28 ^ 0x10)));
        auVar44._0_4_ = fVar5 * auVar11._0_4_;
        auVar44._4_4_ = fVar5 * auVar11._4_4_;
        auVar44._8_4_ = fVar5 * auVar11._8_4_;
        auVar44._12_4_ = fVar5 * auVar11._12_4_;
        auVar11 = vsubps_avx(auVar35,auVar58);
        auVar49._0_4_ = fVar6 * auVar11._0_4_;
        auVar49._4_4_ = fVar6 * auVar11._4_4_;
        auVar49._8_4_ = fVar6 * auVar11._8_4_;
        auVar49._12_4_ = fVar6 * auVar11._12_4_;
        auVar11 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + (uVar31 ^ 0x10)),auVar33,
                                  *(undefined1 (*) [16])(uVar23 + 0x20 + (uVar31 ^ 0x10)));
        auVar11 = vsubps_avx(auVar11,auVar21);
        auVar52._0_4_ = fVar7 * auVar11._0_4_;
        auVar52._4_4_ = fVar7 * auVar11._4_4_;
        auVar52._8_4_ = fVar7 * auVar11._8_4_;
        auVar52._12_4_ = fVar7 * auVar11._12_4_;
        auVar11 = vminps_avx(auVar49,auVar52);
        auVar35 = vminps_avx(auVar61,auVar44);
        auVar11 = vminps_avx(auVar35,auVar11);
        if (uVar24 == 6) {
          auVar11 = vcmpps_avx(auVar34,auVar11,2);
          auVar34 = vcmpps_avx(*(undefined1 (*) [16])(uVar23 + 0xe0),auVar33,2);
          auVar35 = vcmpps_avx(auVar33,*(undefined1 (*) [16])(uVar23 + 0xf0),1);
          auVar34 = vandps_avx(auVar34,auVar35);
          auVar34 = vandps_avx(auVar34,auVar11);
        }
        else {
          auVar34 = vcmpps_avx(auVar34,auVar11,2);
        }
      }
      auVar34 = vpslld_avx(auVar34,0x1f);
      uVar24 = vmovmskps_avx(auVar34);
      if (uVar24 == 0) goto LAB_0052490a;
      uVar24 = uVar24 & 0xff;
      lVar27 = 0;
      for (uVar26 = (ulong)uVar24; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar26 = *(ulong *)(uVar23 + lVar27 * 8);
      uVar24 = uVar24 - 1 & uVar24;
      uVar25 = (ulong)uVar24;
      if (uVar24 != 0) {
        *puVar29 = uVar26;
        lVar27 = 0;
        for (; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
          lVar27 = lVar27 + 1;
        }
        uVar24 = uVar24 - 1 & uVar24;
        uVar25 = (ulong)uVar24;
        bVar32 = uVar24 == 0;
        while( true ) {
          puVar29 = puVar29 + 1;
          uVar26 = *(ulong *)(uVar23 + lVar27 * 8);
          if (bVar32) break;
          *puVar29 = uVar26;
          lVar27 = 0;
          for (uVar26 = uVar25; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
            lVar27 = lVar27 + 1;
          }
          uVar25 = uVar25 - 1 & uVar25;
          bVar32 = uVar25 == 0;
        }
      }
    }
    cVar22 = (**(code **)((long)This->leafIntersector +
                         (ulong)*(byte *)(uVar26 & 0xfffffffffffffff0) * 0x40 + 0x18))
                       (pre,ray,k,context);
    if (cVar22 != '\0') {
      *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
      return bVar10;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }